

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtbp(fitsfile *fptr,char *name,char *value,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  tcolumn *colptr;
  char message [81];
  char *loc;
  char tvalue [71];
  double dvalue;
  LONGLONG jjvalue;
  long ivalue;
  long nfield;
  long repeat;
  long width;
  int local_38;
  int decimals;
  int datacode;
  int tstatus;
  int *status_local;
  char *value_local;
  char *name_local;
  fitsfile *fptr_local;
  
  if (0 < *status) {
    return *status;
  }
  decimals = 0;
  _datacode = status;
  status_local = (int *)value;
  value_local = name;
  name_local = (char *)fptr;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (((value_local[1] < 'T') || ('T' < value_local[1])) ||
     (iVar1 = strncmp(value_local + 1,"TYPE",4), iVar1 != 0)) {
    if (((value_local[1] < 'F') || ('F' < value_local[1])) ||
       (iVar1 = strncmp(value_local + 1,"FORM",4), iVar1 != 0)) {
      if (((value_local[1] < 'B') || ('B' < value_local[1])) ||
         (iVar1 = strncmp(value_local + 1,"BCOL",4), iVar1 != 0)) {
        if (((value_local[1] < 'S') || ('S' < value_local[1])) ||
           (iVar1 = strncmp(value_local + 1,"SCAL",4), iVar1 != 0)) {
          if (((value_local[1] < 'Z') || ('Z' < value_local[1])) ||
             (iVar1 = strncmp(value_local + 1,"ZERO",4), iVar1 != 0)) {
            if (((value_local[1] < 'N') || ('N' < value_local[1])) ||
               (iVar1 = strncmp(value_local + 1,"NULL",4), iVar1 != 0)) {
              if (((value_local[1] < 'D') || ('D' < value_local[1])) ||
                 (iVar1 = strncmp(value_local + 1,"DIM",3), iVar1 != 0)) {
                if ((('G' < value_local[1]) && (value_local[1] < 'I')) &&
                   (iVar1 = strncmp(value_local + 1,"HEAP",4), iVar1 == 0)) {
                  if (*(int *)(*(long *)(name_local + 8) + 0x58) == 1) {
                    return *_datacode;
                  }
                  iVar1 = ffc2jj((char *)status_local,(LONGLONG *)&dvalue,&decimals);
                  if (0 < iVar1) {
                    snprintf((char *)&colptr,0x51,"Error reading value of %s as an integer: %s",
                             value_local,status_local);
                    ffpmsg((char *)&colptr);
                    return *_datacode;
                  }
                  *(double *)(*(long *)(name_local + 8) + 0x3d8) = dvalue;
                  return *_datacode;
                }
              }
              else {
                if (*(int *)(*(long *)(name_local + 8) + 0x58) == 1) {
                  return *_datacode;
                }
                iVar1 = ffc2ii(value_local + 4,&ivalue,&decimals);
                if (0 < iVar1) {
                  return *_datacode;
                }
                if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
                  return *_datacode;
                }
                lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0) + ivalue * 0xa0;
                if ((*(int *)(lVar2 + -0x50) != -9999) && (*(int *)(lVar2 + -0x50) != 0x10)) {
                  return *_datacode;
                }
                register0x00000000 = strchr((char *)status_local,0x28);
                if (register0x00000000 == (char *)0x0) {
                  return *_datacode;
                }
                register0x00000000 = register0x00000000 + 1;
                lVar3 = strtol(register0x00000000,(char **)(message + 0x50),10);
                if ((*(long *)(lVar2 + -0x48) != 1) && (*(long *)(lVar2 + -0x48) < lVar3)) {
                  return *_datacode;
                }
                *(long *)(lVar2 + -8) = lVar3;
              }
            }
            else {
              iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
              if (0 < iVar1) {
                return *_datacode;
              }
              if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
                return *_datacode;
              }
              lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0) + ivalue * 0xa0;
              if (*(int *)(*(long *)(name_local + 8) + 0x58) == 1) {
                iVar1 = ffc2s((char *)status_local,(char *)&loc,&decimals);
                if (0 < iVar1) {
                  return *_datacode;
                }
                strncpy((char *)(lVar2 + -0x28),(char *)&loc,0x11);
                *(undefined1 *)(lVar2 + -0x17) = 0;
              }
              else {
                iVar1 = ffc2jj((char *)status_local,(LONGLONG *)&dvalue,&decimals);
                if (0 < iVar1) {
                  snprintf((char *)&colptr,0x51,"Error reading value of %s as an integer: %s",
                           value_local,status_local);
                  ffpmsg((char *)&colptr);
                  return *_datacode;
                }
                *(double *)(lVar2 + -0x30) = dvalue;
              }
            }
          }
          else {
            iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
            if (0 < iVar1) {
              return *_datacode;
            }
            if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
              return *_datacode;
            }
            lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0);
            iVar1 = ffc2dd((char *)status_local,(double *)(tvalue + 0x40),&decimals);
            if (0 < iVar1) {
              snprintf((char *)&colptr,0x51,"Error reading value of %s as a double: %s",value_local,
                       status_local);
              ffpmsg((char *)&colptr);
              return *_datacode;
            }
            *(undefined8 *)(lVar2 + ivalue * 0xa0 + -0x38) = stack0xffffffffffffff90;
          }
        }
        else {
          iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
          if (0 < iVar1) {
            return *_datacode;
          }
          if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
            return *_datacode;
          }
          lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0);
          iVar1 = ffc2dd((char *)status_local,(double *)(tvalue + 0x40),&decimals);
          if (0 < iVar1) {
            snprintf((char *)&colptr,0x51,"Error reading value of %s as a double: %s",value_local,
                     status_local);
            ffpmsg((char *)&colptr);
            return *_datacode;
          }
          *(undefined8 *)(lVar2 + ivalue * 0xa0 + -0x40) = stack0xffffffffffffff90;
        }
      }
      else {
        iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
        if (0 < iVar1) {
          return *_datacode;
        }
        if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
          return *_datacode;
        }
        lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0);
        if (*(int *)(*(long *)(name_local + 8) + 0x58) == 2) {
          return *_datacode;
        }
        iVar1 = ffc2ii((char *)status_local,&jjvalue,_datacode);
        if (0 < iVar1) {
          snprintf((char *)&colptr,0x51,"Error reading value of %s as an integer: %s",value_local,
                   status_local);
          ffpmsg((char *)&colptr);
          return *_datacode;
        }
        *(LONGLONG *)(lVar2 + ivalue * 0xa0 + -0x58) = jjvalue + -1;
      }
    }
    else {
      iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
      if (0 < iVar1) {
        return *_datacode;
      }
      if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
        return *_datacode;
      }
      lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0) + ivalue * 0xa0;
      iVar1 = ffc2s((char *)status_local,(char *)&loc,&decimals);
      if (0 < iVar1) {
        return *_datacode;
      }
      strncpy((char *)(lVar2 + -0x14),(char *)&loc,9);
      *(undefined1 *)(lVar2 + -0xb) = 0;
      if (*(int *)(*(long *)(name_local + 8) + 0x58) == 1) {
        iVar1 = ffasfm((char *)&loc,&local_38,&repeat,(int *)((long)&width + 4),_datacode);
        if (0 < iVar1) {
          return *_datacode;
        }
        *(undefined4 *)(lVar2 + -0x50) = 0x10;
        *(undefined8 *)(lVar2 + -0x48) = 1;
        *(long *)(lVar2 + -8) = repeat;
      }
      else {
        iVar1 = ffbnfm((char *)&loc,&local_38,&nfield,&repeat,_datacode);
        if (0 < iVar1) {
          return *_datacode;
        }
        *(int *)(lVar2 + -0x50) = local_38;
        *(long *)(lVar2 + -0x48) = nfield;
        if (local_38 == 0x10) {
          if ((*(long *)(lVar2 + -8) == 0) || (nfield < *(long *)(lVar2 + -8))) {
            *(long *)(lVar2 + -8) = repeat;
          }
        }
        else {
          *(long *)(lVar2 + -8) = repeat;
        }
      }
    }
  }
  else {
    iVar1 = ffc2ii(value_local + 5,&ivalue,&decimals);
    if (0 < iVar1) {
      return *_datacode;
    }
    if ((ivalue < 1) || (*(int *)(*(long *)(name_local + 8) + 0x3b0) < ivalue)) {
      return *_datacode;
    }
    lVar2 = *(long *)(*(long *)(name_local + 8) + 0x3d0);
    iVar1 = ffc2s((char *)status_local,(char *)&loc,&decimals);
    if (0 < iVar1) {
      return *_datacode;
    }
    strcpy((char *)(lVar2 + ivalue * 0xa0 + -0xa0),(char *)&loc);
  }
  return *_datacode;
}

Assistant:

int ffgtbp(fitsfile *fptr,     /* I - FITS file pointer   */
           char *name,         /* I - name of the keyword */
           char *value,        /* I - value string of the keyword */
           int *status)        /* IO - error status       */
{
/*
  Get TaBle Parameter.  The input keyword name begins with the letter T.
  Test if the keyword is one of the table column definition keywords
  of an ASCII or binary table. If so, decode it and update the value 
  in the structure.
*/
    int tstatus, datacode, decimals;
    long width, repeat, nfield, ivalue;
    LONGLONG jjvalue;
    double dvalue;
    char tvalue[FLEN_VALUE], *loc;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    tstatus = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if(!FSTRNCMP(name + 1, "TYPE", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield ) /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strcpy(colptr->ttype, tvalue);  /* copy col name to structure */
    }
    else if(!FSTRNCMP(name + 1, "FORM", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strncpy(colptr->tform, tvalue, 9);  /* copy TFORM to structure */
        colptr->tform[9] = '\0';            /* make sure it is terminated */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
          if (ffasfm(tvalue, &datacode, &width, &decimals, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = TSTRING; /* store datatype code */
          colptr->trepeat = 1;      /* field repeat count == 1 */
          colptr->twidth = width;   /* the width of the field, in bytes */
        }
        else  /* binary table */
        {
          if (ffbnfm(tvalue, &datacode, &repeat, &width, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = datacode; /* store datatype code */
          colptr->trepeat = (LONGLONG) repeat;     /* field repeat count  */

          /* Don't overwrite the unit string width if it was previously */
	  /* set by a TDIMn keyword and has a legal value */
          if (datacode == TSTRING) {
	    if (colptr->twidth == 0 || colptr->twidth > repeat)
              colptr->twidth = width;   /*  width of a unit string */

          } else {
              colptr->twidth = width;   /*  width of a unit value in chars */
          }
        }
    }
    else if(!FSTRNCMP(name + 1, "BCOL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == BINARY_TBL)
            return(*status);  /* binary tables don't have TBCOL keywords */

        if (ffc2ii(value, &ivalue, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);
            return(*status);
        }
        colptr->tbcol = ivalue - 1; /* convert to zero base */
    }
    else if(!FSTRNCMP(name + 1, "SCAL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tscale = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "ZERO", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tzero = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "NULL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
            if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
                return(*status);

            strncpy(colptr->strnull, tvalue, 17);  /* copy TNULL string */
            colptr->strnull[17] = '\0';  /* terminate the strnull field */

        }
        else  /* binary table */
        {
            if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
            {
                snprintf(message,FLEN_ERRMSG,
                "Error reading value of %s as an integer: %s", name, value);
                ffpmsg(message);

                /* ignore this error, so don't return error status */
                return(*status);
            }
            colptr->tnull = jjvalue; /* null value for integer column */
        }
    }
    else if(!FSTRNCMP(name + 1, "DIM", 3) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't support TDIMn keyword */ 

        /* get the index number */
        if( ffc2ii(name + 4, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;     /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        /* uninitialized columns have tdatatype set = -9999 */
        if (colptr->tdatatype != -9999 && colptr->tdatatype != TSTRING)
	    return(*status);     /* this is not an ASCII string column */
	   
        loc = strchr(value, '(' );  /* find the opening parenthesis */
        if (!loc)
            return(*status);   /* not a proper TDIM keyword */

        loc++;
        width = strtol(loc, &loc, 10);  /* read size of first dimension */
        if (colptr->trepeat != 1 && colptr->trepeat < width)
	    return(*status);  /* string length is greater than column width */

        colptr->twidth = width;   /* set width of a unit string in chars */
    }
    else if (!FSTRNCMP(name + 1, "HEAP", 4) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't have a heap */ 

        if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        (fptr->Fptr)->heapstart = jjvalue; /* starting byte of the heap */
        return(*status);
    }

    return(*status);
}